

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v10::detail::
     handle_dynamic_spec<fmt::v10::detail::precision_checker,fmt::v10::basic_format_context<fmt::v10::appender,char>>
               (int *value,arg_ref<char> ref,basic_format_context<fmt::v10::appender,_char> *ctx)

{
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> arg;
  basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> arg_00;
  undefined1 auVar1 [20];
  undefined8 ctx_00;
  int iVar2;
  int in_ECX;
  basic_format_context<fmt::v10::appender,_char> *ctx_01;
  size_t in_R8;
  basic_string_view<char> id;
  arg_ref<char> *paVar3;
  format_arg local_58;
  format_arg local_38;
  basic_format_context<fmt::v10::appender,_char> *local_18;
  basic_format_context<fmt::v10::appender,_char> *ctx_local;
  int *value_local;
  
  auVar1 = (undefined1  [20])ref._4_20_;
  paVar3 = &ref;
  if (ref.kind != none) {
    ref._4_20_ = auVar1;
    local_18 = ctx;
    ctx_local = (basic_format_context<fmt::v10::appender,_char> *)value;
    if (ref.kind == index) {
      ctx_01 = (basic_format_context<fmt::v10::appender,_char> *)(ulong)(uint)ref.val.index;
      get_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>,int>
                (&local_38,(detail *)ctx,ctx_01,in_ECX);
      arg.value_.field_0.string.size = local_38._16_8_;
      arg.value_.field_0.long_long_value = local_38.value_.field_0.string.size;
      arg.type_ = local_38._24_4_;
      arg._20_4_ = local_38._28_4_;
      arg._24_8_ = paVar3;
      iVar2 = get_dynamic_spec<fmt::v10::detail::precision_checker,fmt::v10::basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>>>
                        (arg);
      *(int *)&(ctx_local->out_).super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
               container = iVar2;
    }
    else if (ref.kind == name) {
      ctx_00 = ref.val.name.data_;
      id.size_ = in_R8;
      id.data_ = (char *)ref.val.name.size_;
      get_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>,fmt::v10::basic_string_view<char>>
                (&local_58,(detail *)ctx,(basic_format_context<fmt::v10::appender,_char> *)ctx_00,id
                );
      arg_00.value_.field_0.string.size = local_58._16_8_;
      arg_00.value_.field_0.long_long_value = local_58.value_.field_0.string.size;
      arg_00.type_ = local_58._24_4_;
      arg_00._20_4_ = local_58._28_4_;
      arg_00._24_8_ = paVar3;
      iVar2 = get_dynamic_spec<fmt::v10::detail::precision_checker,fmt::v10::basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,char>>>
                        (arg_00);
      *(int *)&(ctx_local->out_).super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.
               container = iVar2;
    }
  }
  return;
}

Assistant:

FMT_CONSTEXPR void handle_dynamic_spec(int& value,
                                       arg_ref<typename Context::char_type> ref,
                                       Context& ctx) {
  switch (ref.kind) {
  case arg_id_kind::none:
    break;
  case arg_id_kind::index:
    value = detail::get_dynamic_spec<Handler>(get_arg(ctx, ref.val.index));
    break;
  case arg_id_kind::name:
    value = detail::get_dynamic_spec<Handler>(get_arg(ctx, ref.val.name));
    break;
  }
}